

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O1

size_t duckdb_je_malloc_usable_size(void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  tsd_t *tsd;
  size_t sVar4;
  void *pvVar5;
  ulong uVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_cache_elm_t *prVar10;
  rtree_ctx_t *rtree_ctx;
  bool bVar11;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (duckdb_je_tsd_booted) {
    tsd = (tsd_t *)__tls_get_addr(&PTR_024e0b60);
    if ((tsd->state).repr != '\0') {
      tsd = duckdb_je_tsd_fetch_slow(tsd,false);
    }
  }
  else {
    tsd = (tsd_t *)0x0;
  }
  if (ptr == (void *)0x0) {
    sVar4 = 0;
  }
  else {
    if (tsd == (tsd_t *)0x0) {
      duckdb_je_rtree_ctx_data_init(&rStack_198);
    }
    else {
      rtree_ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    pvVar5 = (void *)((ulong)ptr & 0xffffffffc0000000);
    uVar6 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
    prVar7 = (rtree_leaf_elm_t *)((long)&rtree_ctx->cache[0].leafkey + uVar6);
    pvVar2 = *(void **)((long)&rtree_ctx->cache[0].leafkey + uVar6);
    if (pvVar2 == pvVar5) {
      prVar7 = (rtree_leaf_elm_t *)
               ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar7[1].le_bits.repr);
    }
    else if ((void *)rtree_ctx->l2_cache[0].leafkey == pvVar5) {
      prVar3 = rtree_ctx->l2_cache[0].leaf;
      rtree_ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
      rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar7[1].le_bits.repr;
      (prVar7->le_bits).repr = pvVar5;
      prVar7[1].le_bits.repr = prVar3;
      prVar7 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
    }
    else {
      prVar9 = rtree_ctx->l2_cache + 1;
      if ((void *)rtree_ctx->l2_cache[1].leafkey == pvVar5) {
        uVar8 = 0;
        bVar11 = false;
      }
      else {
        uVar6 = 1;
        prVar10 = prVar9;
        do {
          uVar8 = uVar6;
          bVar11 = 6 < uVar8;
          if (uVar8 == 7) goto LAB_00cf9934;
          prVar9 = prVar10 + 1;
          prVar1 = prVar10 + 1;
          uVar6 = uVar8 + 1;
          prVar10 = prVar9;
        } while ((void *)prVar1->leafkey != pvVar5);
        bVar11 = 6 < uVar8;
      }
      prVar3 = prVar9->leaf;
      prVar9->leafkey = rtree_ctx->l2_cache[uVar8].leafkey;
      prVar9->leaf = rtree_ctx->l2_cache[uVar8].leaf;
      rtree_ctx->l2_cache[uVar8].leafkey = (uintptr_t)pvVar2;
      rtree_ctx->l2_cache[uVar8].leaf = (rtree_leaf_elm_t *)prVar7[1].le_bits.repr;
      (prVar7->le_bits).repr = pvVar5;
      prVar7[1].le_bits.repr = prVar3;
      prVar7 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_00cf9934:
      if (bVar11) {
        prVar7 = duckdb_je_rtree_leaf_elm_lookup_hard
                           ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                            (uintptr_t)ptr,true,false);
      }
    }
    sVar4 = duckdb_je_sz_index2size_tab[(ulong)(prVar7->le_bits).repr >> 0x30];
  }
  return sVar4;
}

Assistant:

JEMALLOC_NOTHROW
je_malloc_usable_size(JEMALLOC_USABLE_SIZE_CONST void *ptr) {
	LOG("core.malloc_usable_size.entry", "ptr: %p", ptr);

	size_t ret = je_malloc_usable_size_impl(ptr);

	LOG("core.malloc_usable_size.exit", "result: %zu", ret);
	return ret;
}